

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<Fad<double>_>::Substitution(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  int i_1;
  int i;
  ulong uVar10;
  long lVar11;
  long lVar12;
  Fad<double> local_128;
  long local_108;
  long local_100;
  int64_t local_f8;
  TPZMatrix<Fad<double>_> *local_f0;
  Fad<double> local_e8;
  Fad<double> local_c8;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_a8;
  FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_> local_98;
  Fad<double> local_88;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  Fad<double> local_50;
  
  local_108 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  local_f8 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  local_f0 = this;
  if (local_108 != (this->super_TPZBaseMatrix).fRow) {
    Error("SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  if (0 < local_108) {
    lVar12 = 0;
    do {
      if (0 < local_f8) {
        lVar5 = 0;
        local_100 = lVar12;
        do {
          if (lVar12 != 0) {
            lVar11 = 0;
            do {
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_c8,B,lVar12,lVar5);
              (*(local_f0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_e8,local_f0,lVar12,lVar11);
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_88,B,lVar11,lVar5);
              local_a8.fadexpr_.left_ = &local_e8;
              local_98.left_ = &local_c8;
              local_98.right_ = &local_a8;
              local_128.val_ = local_c8.val_ - local_e8.val_ * local_88.val_;
              uVar4 = local_88.dx_.num_elts;
              if (local_88.dx_.num_elts < local_e8.dx_.num_elts) {
                uVar4 = local_e8.dx_.num_elts;
              }
              if ((int)uVar4 < local_c8.dx_.num_elts) {
                uVar4 = local_c8.dx_.num_elts;
              }
              local_128.dx_.num_elts = 0;
              local_128.dx_.ptr_to_data = (double *)0x0;
              local_a8.fadexpr_.right_ = &local_88;
              if ((int)uVar4 < 1) {
                local_128.defaultVal = 0.0;
                lVar12 = local_100;
              }
              else {
                local_128.dx_.num_elts = uVar4;
                local_128.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar4 * 8);
                lVar12 = local_100;
                local_128.defaultVal = 0.0;
                uVar10 = 0;
                do {
                  vVar1 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                          ::dx(&local_98,(int)uVar10);
                  local_128.dx_.ptr_to_data[uVar10] = vVar1;
                  uVar10 = uVar10 + 1;
                } while (uVar4 != uVar10);
              }
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x23])(B,lVar12,lVar5,&local_128);
              Fad<double>::~Fad(&local_128);
              Fad<double>::~Fad(&local_88);
              Fad<double>::~Fad(&local_e8);
              Fad<double>::~Fad(&local_c8);
              lVar11 = lVar11 + 1;
            } while (lVar11 != lVar12);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != local_f8);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != local_108);
  }
  if (0 < local_f8) {
    lVar12 = 0;
    do {
      lVar5 = local_108;
      if (0 < local_108) {
        do {
          lVar11 = lVar5 + -1;
          local_100 = lVar5;
          if (lVar5 < local_108) {
            do {
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_c8,B,lVar11,lVar12);
              (*(local_f0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_e8,local_f0,lVar11,lVar5);
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_88,B,lVar5,lVar12);
              local_a8.fadexpr_.left_ = &local_e8;
              local_98.left_ = &local_c8;
              local_98.right_ = &local_a8;
              local_128.val_ = local_c8.val_ - local_e8.val_ * local_88.val_;
              uVar4 = local_88.dx_.num_elts;
              if (local_88.dx_.num_elts < local_e8.dx_.num_elts) {
                uVar4 = local_e8.dx_.num_elts;
              }
              if ((int)uVar4 < local_c8.dx_.num_elts) {
                uVar4 = local_c8.dx_.num_elts;
              }
              local_128.dx_.num_elts = 0;
              local_128.dx_.ptr_to_data = (double *)0x0;
              local_a8.fadexpr_.right_ = &local_88;
              if ((int)uVar4 < 1) {
                local_128.defaultVal = 0.0;
              }
              else {
                local_128.dx_.num_elts = uVar4;
                local_128.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar4 * 8);
                local_128.defaultVal = 0.0;
                uVar10 = 0;
                do {
                  vVar1 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                          ::dx(&local_98,(int)uVar10);
                  local_128.dx_.ptr_to_data[uVar10] = vVar1;
                  uVar10 = uVar10 + 1;
                } while (uVar4 != uVar10);
              }
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x23])(B,lVar11,lVar12,&local_128);
              Fad<double>::~Fad(&local_128);
              Fad<double>::~Fad(&local_88);
              Fad<double>::~Fad(&local_e8);
              Fad<double>::~Fad(&local_c8);
              lVar5 = lVar5 + 1;
            } while (lVar5 != local_108);
          }
          (*(local_f0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_50,local_f0,lVar11,lVar11);
          local_68 = ABS(local_50.val_);
          uStack_60 = 0;
          Fad<double>::~Fad(&local_50);
          if (local_68 < 1e-12) {
            Error("BackSub( SubstitutionLU ) <Matrix is singular",(char *)0x0);
          }
          (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_c8,B,lVar11,lVar12);
          (*(local_f0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_e8,local_f0,lVar11,lVar11);
          iVar3 = local_c8.dx_.num_elts;
          iVar2 = local_e8.dx_.num_elts;
          local_128.val_ = local_c8.val_ / local_e8.val_;
          uVar4 = local_e8.dx_.num_elts;
          if (local_e8.dx_.num_elts < local_c8.dx_.num_elts) {
            uVar4 = local_c8.dx_.num_elts;
          }
          local_128.dx_.num_elts = 0;
          local_128.dx_.ptr_to_data = (double *)0x0;
          if (0 < (int)uVar4) {
            local_58 = local_e8.val_;
            local_68 = local_c8.val_;
            local_128.dx_.num_elts = uVar4;
            local_128.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar4 * 8);
            uVar10 = 0;
            pdVar6 = local_c8.dx_.ptr_to_data;
            pdVar7 = local_e8.dx_.ptr_to_data;
            do {
              pdVar8 = pdVar6;
              if (iVar3 == 0) {
                pdVar8 = &local_c8.defaultVal;
              }
              pdVar9 = pdVar7;
              if (iVar2 == 0) {
                pdVar9 = &local_e8.defaultVal;
              }
              local_128.dx_.ptr_to_data[uVar10] =
                   (*pdVar8 * local_58 - *pdVar9 * local_68) / (local_58 * local_58);
              uVar10 = uVar10 + 1;
              pdVar7 = pdVar7 + 1;
              pdVar6 = pdVar6 + 1;
            } while (uVar4 != uVar10);
          }
          local_128.defaultVal = 0.0;
          (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(B,lVar11,lVar12,&local_128);
          Fad<double>::~Fad(&local_128);
          Fad<double>::~Fad(&local_e8);
          Fad<double>::~Fad(&local_c8);
          lVar5 = lVar11;
        } while (1 < local_100);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != local_f8);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const{
	
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    if ( rowb != Rows() )
		Error( "SubstitutionLU <incompatible dimensions>" );
	int64_t i;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ ) {
            for ( int64_t j = 0; j < i; j++ ) {
                B->PutVal( i, col, B->GetVal(i, col)-GetVal(i, j) * B->GetVal(j, col) );
            }
        }
    }
    for (int64_t col=0; col<colb; col++) {
        for ( i = rowb-1; i >= 0; i-- ) {
            for ( int64_t j = i+1; j < rowb ; j++ ) {
                B->PutVal( i, col, B->GetVal(i, col) -
						  GetVal(i, j) * B->GetVal(j, col) );
            }
            if ( IsZero( GetVal(i, i) ) ) {
				Error( "BackSub( SubstitutionLU ) <Matrix is singular" );
            }
            B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
		}
    }
    return( 1 );
}